

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O3

int parse_rockridge(archive_read *a,file_info *file,uchar *p,uchar *end)

{
  archive_string *as;
  archive_string *as_00;
  ulong *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  void *pvVar6;
  void *pvVar7;
  void *__src;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  void *__dest;
  time_t tVar11;
  ulong *puVar12;
  char *pcVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  long lVar18;
  byte *pbVar19;
  uint *p_00;
  uint uVar20;
  
  p_00 = (uint *)(p + 4);
  if (p_00 <= end) {
    pvVar6 = a->format->data;
    as = &file->symlink;
    as_00 = &file->name;
    do {
      bVar2 = *p;
      if (0x19 < (byte)(bVar2 + 0xbf)) {
        return 0;
      }
      bVar3 = p[1];
      if (0x19 < (byte)(bVar3 + 0xbf)) {
        return 0;
      }
      bVar4 = p[2];
      if ((ulong)bVar4 < 4) {
        return 0;
      }
      if (end < p + bVar4) {
        return 0;
      }
      uVar9 = bVar4 - 4;
      bVar5 = p[3];
      if (0xc < bVar2 - 0x4e) {
        if (bVar2 == 0x43) {
          if (bVar3 == 0x4c) {
            if (uVar9 == 8 && bVar5 == 1) {
              file->cl_offset = (ulong)*p_00 * *(long *)((long)pvVar6 + 0xa8);
              goto switchD_0012875d_caseD_3;
            }
          }
          else if ((bVar3 == 0x45) && (uVar9 == 0x18 && bVar5 == 1)) {
            uVar9 = *p_00;
            uVar16 = *(uint *)(p + 0xc);
            file->ce_offset = uVar16;
            uVar20 = *(uint *)(p + 0x14);
            file->ce_size = uVar20;
            pvVar7 = a->format->data;
            uVar17 = (long)(int)uVar9 * *(ulong *)((long)pvVar7 + 0xa8);
            if ((((file->mode & 0xf000) == 0x8000) && (file->offset <= uVar17)) ||
               (((uVar17 < *(ulong *)((long)pvVar7 + 0xa0) ||
                 (uVar10 = (ulong)uVar20 + (ulong)uVar16, *(ulong *)((long)pvVar7 + 0xa8) < uVar10))
                || (*(ulong *)((long)pvVar7 + 0xb0) < uVar10 + uVar17)))) {
              pcVar13 = "Invalid parameter in SUSP \"CE\" extension";
              iVar15 = -1;
LAB_00128ee9:
              archive_set_error(&a->archive,iVar15,pcVar13);
              return -0x1e;
            }
            uVar9 = *(uint *)((long)pvVar7 + 0x40);
            uVar10 = (ulong)uVar9;
            iVar15 = *(int *)((long)pvVar7 + 0x44);
            if (iVar15 <= (int)uVar9) {
              uVar16 = iVar15 * 2;
              if (iVar15 < 0x10) {
                uVar16 = 0x10;
              }
              if (((int)uVar16 <= iVar15) ||
                 (__dest = calloc((ulong)uVar16,0x10), __dest == (void *)0x0)) {
                pcVar13 = "Out of memory";
                iVar15 = 0xc;
                goto LAB_00128ee9;
              }
              __src = *(void **)((long)pvVar7 + 0x38);
              if (__src != (void *)0x0) {
                memcpy(__dest,__src,(long)(int)uVar9 << 4);
                free(__src);
                uVar10 = (ulong)*(uint *)((long)pvVar7 + 0x40);
              }
              *(void **)((long)pvVar7 + 0x38) = __dest;
              *(uint *)((long)pvVar7 + 0x44) = uVar16;
            }
            *(int *)((long)pvVar7 + 0x40) = (int)uVar10 + 1;
            if (0 < (int)uVar10) {
              do {
                uVar9 = (int)uVar10 - 1;
                uVar14 = (ulong)(uVar9 >> 1);
                lVar8 = *(long *)((long)pvVar7 + 0x38);
                lVar18 = uVar14 * 0x10;
                puVar1 = (ulong *)(lVar8 + uVar10 * 0x10);
                if (*(ulong *)(lVar8 + lVar18) <= uVar17) {
                  *puVar1 = uVar17;
                  *(file_info **)(lVar8 + 8 + uVar10 * 0x10) = file;
                  goto switchD_00128708_caseD_4f;
                }
                puVar12 = (ulong *)(lVar8 + lVar18);
                uVar10 = puVar12[1];
                *puVar1 = *puVar12;
                puVar1[1] = uVar10;
                uVar10 = uVar14;
              } while (1 < uVar9);
            }
            puVar1 = *(ulong **)((long)pvVar7 + 0x38);
            *puVar1 = uVar17;
            puVar1[1] = (ulong)file;
          }
        }
        goto switchD_00128708_caseD_4f;
      }
      uVar16 = (uint)bVar4;
      switch((uint)bVar2) {
      case 0x4e:
        if (bVar5 != 1 || bVar3 != 0x4d) break;
        if (file->name_continues == '\0') {
          (file->name).length = 0;
        }
        file->name_continues = '\0';
        if (bVar4 < 5) goto switchD_0012875d_caseD_3;
        switch((byte)*p_00) {
        case 0:
          if (uVar9 != 1) {
            archive_strncat(as_00,p + 5,(ulong)(uVar16 - 5));
          }
          break;
        case 1:
          if (uVar9 != 1) {
            archive_strncat(as_00,p + 5,(ulong)(uVar16 - 5));
            file->name_continues = '\x01';
          }
          break;
        case 2:
          pcVar13 = ".";
          goto LAB_00128e79;
        case 4:
          pcVar13 = "..";
LAB_00128e79:
          archive_strcat(as_00,pcVar13);
        }
switchD_0012875d_caseD_3:
        *(undefined1 *)((long)pvVar6 + 0x28) = 1;
        break;
      case 0x50:
        if (bVar3 == 0x4e) {
          if (uVar9 == 0x10 && bVar5 == 1) {
            uVar9 = toi(p_00,4);
            file->rdev = (ulong)uVar9 << 0x20;
            uVar16 = toi(p + 0xc,4);
            file->rdev = CONCAT44(uVar9,uVar16);
            *(undefined1 *)((long)pvVar6 + 0x28) = 1;
          }
        }
        else if (bVar5 == 1 && bVar3 == 0x58) {
          if (0xb < bVar4) {
            uVar9 = toi(p_00,4);
            file->mode = uVar9;
            if (0x13 < bVar4) {
              uVar9 = toi(p + 0xc,4);
              file->nlinks = uVar9;
              if (0x1b < bVar4) {
                uVar9 = toi(p + 0x14,4);
                file->uid = uVar9;
                if (0x23 < bVar4) {
                  uVar9 = toi(p + 0x1c,4);
                  file->gid = uVar9;
                  if (0x2b < bVar4) {
                    uVar9 = toi(p + 0x24,4);
                    file->number = (ulong)uVar9;
                  }
                }
              }
            }
          }
          goto switchD_0012875d_caseD_3;
        }
        break;
      case 0x52:
        if (bVar5 == 1 && bVar3 == 0x45) {
          file->re = '\x01';
          *(undefined1 *)((long)pvVar6 + 0x28) = 1;
        }
        break;
      case 0x53:
        if (bVar3 == 0x4c) {
          if (bVar5 == 1) {
            if ((file->symlink_continues == '\0') || ((file->symlink).length == 0)) {
              (file->symlink).length = 0;
            }
            file->symlink_continues = '\0';
            if (4 < bVar4) {
              if ((byte)*p_00 != 0) {
                if ((byte)*p_00 != 1) goto switchD_00128a2f_caseD_3;
                file->symlink_continues = '\x01';
              }
              if (2 < uVar9) {
                iVar15 = uVar16 - 5;
                pbVar19 = p + 5;
                pcVar13 = "";
                do {
                  bVar2 = *pbVar19;
                  uVar9 = (uint)pbVar19[1];
                  pbVar19 = pbVar19 + 2;
                  uVar16 = iVar15 - 2;
                  archive_strcat(as,pcVar13);
                  switch(bVar2) {
                  case 0:
                    if (uVar9 <= uVar16) {
                      archive_strncat(as,pbVar19,(ulong)uVar9);
                      goto LAB_00128a8f;
                    }
                    goto switchD_00128a2f_caseD_3;
                  case 1:
                    if (uVar16 < uVar9) goto switchD_00128a2f_caseD_3;
                    archive_strncat(as,pbVar19,(ulong)uVar9);
                    break;
                  case 2:
                    pcVar13 = ".";
                    goto LAB_00128a8a;
                  case 3:
                  case 5:
                  case 6:
                  case 7:
                    goto switchD_00128a2f_caseD_3;
                  case 4:
                    pcVar13 = "..";
LAB_00128a8a:
                    archive_strcat(as,pcVar13);
LAB_00128a8f:
                    pcVar13 = "/";
                    goto LAB_00128af2;
                  case 8:
                    archive_strcat(as,"/");
                    break;
                  default:
                    if (bVar2 == 0x10) {
                      (file->symlink).length = 0;
                      archive_strcat(as,"ROOT");
                      pcVar13 = "/";
                      goto LAB_00128af2;
                    }
                    if (bVar2 == 0x20) {
                      pcVar13 = "hostname";
                      goto LAB_00128a8a;
                    }
                    goto switchD_00128a2f_caseD_3;
                  }
                  pcVar13 = "";
LAB_00128af2:
                  pbVar19 = pbVar19 + uVar9;
                  iVar15 = uVar16 - uVar9;
                } while (1 < iVar15);
              }
            }
switchD_00128a2f_caseD_3:
            *(undefined1 *)((long)pvVar6 + 0x28) = 1;
          }
        }
        else if (((bVar3 == 0x54) && (bVar4 == 4)) && (bVar5 == 1)) {
          *(undefined2 *)((long)pvVar6 + 0x28) = 0;
          return 0;
        }
        break;
      case 0x54:
        if (bVar5 == 1 && bVar3 == 0x46) {
          if (4 < bVar4) {
            bVar2 = (byte)*p_00;
            pbVar19 = p + 5;
            uVar20 = bVar4 - 5;
            if ((char)bVar2 < '\0') {
              if ((0x11 < uVar9) && ((bVar2 & 1) != 0)) {
                file->birthtime_is_set = 1;
                tVar11 = isodate17(pbVar19);
                file->birthtime = tVar11;
                pbVar19 = p + 0x16;
                uVar20 = uVar16 - 0x16;
              }
              if (((bVar2 & 2) != 0) && (0x10 < uVar20)) {
                tVar11 = isodate17(pbVar19);
                file->mtime = tVar11;
                pbVar19 = pbVar19 + 0x11;
                uVar20 = uVar20 - 0x11;
              }
              if (((bVar2 & 4) != 0) && (0x10 < uVar20)) {
                tVar11 = isodate17(pbVar19);
                file->atime = tVar11;
                pbVar19 = pbVar19 + 0x11;
                uVar20 = uVar20 - 0x11;
              }
              if (((bVar2 & 8) != 0) && (0x10 < uVar20)) {
                tVar11 = isodate17(pbVar19);
                goto LAB_00128e21;
              }
            }
            else {
              if ((7 < uVar9) && ((bVar2 & 1) != 0)) {
                file->birthtime_is_set = 1;
                tVar11 = isodate7(pbVar19);
                file->birthtime = tVar11;
                pbVar19 = p + 0xc;
                uVar20 = uVar16 - 0xc;
              }
              if (((bVar2 & 2) != 0) && (6 < uVar20)) {
                tVar11 = isodate7(pbVar19);
                file->mtime = tVar11;
                pbVar19 = pbVar19 + 7;
                uVar20 = uVar20 - 7;
              }
              if (((bVar2 & 4) != 0) && (6 < uVar20)) {
                tVar11 = isodate7(pbVar19);
                file->atime = tVar11;
                pbVar19 = pbVar19 + 7;
                uVar20 = uVar20 - 7;
              }
              if (((bVar2 & 8) != 0) && (6 < uVar20)) {
                tVar11 = isodate7(pbVar19);
LAB_00128e21:
                file->ctime = tVar11;
              }
            }
          }
          goto switchD_0012875d_caseD_3;
        }
        break;
      case 0x5a:
        if (((bVar5 == 1 && bVar3 == 0x46) && ((byte)*p_00 == 0x70)) &&
           ((uVar9 == 0xc && (p[5] == 0x7a)))) {
          file->pz = 1;
          file->pz_log2_bs = (uint)p[7];
          file->pz_uncompressed_size = (ulong)*(uint *)(p + 8);
        }
      }
switchD_00128708_caseD_4f:
      p_00 = (uint *)(p + (ulong)p[2] + 4);
      p = p + p[2];
    } while (p_00 <= end);
  }
  return 0;
}

Assistant:

static int
parse_rockridge(struct archive_read *a, struct file_info *file,
    const unsigned char *p, const unsigned char *end)
{
	struct iso9660 *iso9660;

	iso9660 = (struct iso9660 *)(a->format->data);

	while (p + 4 <= end  /* Enough space for another entry. */
	    && p[0] >= 'A' && p[0] <= 'Z' /* Sanity-check 1st char of name. */
	    && p[1] >= 'A' && p[1] <= 'Z' /* Sanity-check 2nd char of name. */
	    && p[2] >= 4 /* Sanity-check length. */
	    && p + p[2] <= end) { /* Sanity-check length. */
		const unsigned char *data = p + 4;
		int data_length = p[2] - 4;
		int version = p[3];

		switch(p[0]) {
		case 'C':
			if (p[1] == 'E') {
				if (version == 1 && data_length == 24) {
					/*
					 * CE extension comprises:
					 *   8 byte sector containing extension
					 *   8 byte offset w/in above sector
					 *   8 byte length of continuation
					 */
					int32_t location =
					    archive_le32dec(data);
					file->ce_offset =
					    archive_le32dec(data+8);
					file->ce_size =
					    archive_le32dec(data+16);
					if (register_CE(a, location, file)
					    != ARCHIVE_OK)
						return (ARCHIVE_FATAL);
				}
			}
			else if (p[1] == 'L') {
				if (version == 1 && data_length == 8) {
					file->cl_offset = (uint64_t)
					    iso9660->logical_block_size *
					    (uint64_t)archive_le32dec(data);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'N':
			if (p[1] == 'M') {
				if (version == 1) {
					parse_rockridge_NM1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'P':
			/*
			 * PD extension is padding;
			 * contents are always ignored.
			 *
			 * PL extension won't appear;
			 * contents are always ignored.
			 */
			if (p[1] == 'N') {
				if (version == 1 && data_length == 16) {
					file->rdev = toi(data,4);
					file->rdev <<= 32;
					file->rdev |= toi(data + 8, 4);
					iso9660->seenRockridge = 1;
				}
			}
			else if (p[1] == 'X') {
				/*
				 * PX extension comprises:
				 *   8 bytes for mode,
				 *   8 bytes for nlinks,
				 *   8 bytes for uid,
				 *   8 bytes for gid,
				 *   8 bytes for inode.
				 */
				if (version == 1) {
					if (data_length >= 8)
						file->mode
						    = toi(data, 4);
					if (data_length >= 16)
						file->nlinks
						    = toi(data + 8, 4);
					if (data_length >= 24)
						file->uid
						    = toi(data + 16, 4);
					if (data_length >= 32)
						file->gid
						    = toi(data + 24, 4);
					if (data_length >= 40)
						file->number
						    = toi(data + 32, 4);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'R':
			if (p[1] == 'E' && version == 1) {
				file->re = 1;
				iso9660->seenRockridge = 1;
			}
			else if (p[1] == 'R' && version == 1) {
				/*
				 * RR extension comprises:
				 *    one byte flag value
				 * This extension is obsolete,
				 * so contents are always ignored.
				 */
			}
			break;
		case 'S':
			if (p[1] == 'L') {
				if (version == 1) {
					parse_rockridge_SL1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			else if (p[1] == 'T'
			    && data_length == 0 && version == 1) {
				/*
				 * ST extension marks end of this
				 * block of SUSP entries.
				 *
				 * It allows SUSP to coexist with
				 * non-SUSP uses of the System
				 * Use Area by placing non-SUSP data
				 * after SUSP data.
				 */
				iso9660->seenSUSP = 0;
				iso9660->seenRockridge = 0;
				return (ARCHIVE_OK);
			}
			break;
		case 'T':
			if (p[1] == 'F') {
				if (version == 1) {
					parse_rockridge_TF1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'Z':
			if (p[1] == 'F') {
				if (version == 1)
					parse_rockridge_ZF1(file,
					    data, data_length);
			}
			break;
		default:
			break;
		}

		p += p[2];
	}
	return (ARCHIVE_OK);
}